

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

void __thiscall train_context::train_context(train_context *this,int n_embd_,int n_layers_)

{
  undefined8 uVar1;
  long lVar2;
  void *pvVar3;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  ggml_tensor *t;
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty;
  int il;
  ggml_init_params params_ggml;
  value_type *__x;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_stack_ffffffffffffff20;
  int local_5c;
  undefined7 uStack_17;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x17e028);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x17e03b);
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::vector
            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x17e04e);
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::vector
            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x17e061);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)0x17e074);
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  ggml_tensor_overhead();
  __x = (value_type *)CONCAT71(uStack_17,1);
  uVar1 = ggml_init();
  *in_RDI = uVar1;
  for (local_5c = 0; local_5c < *(int *)((long)in_RDI + 0xc) + -1; local_5c = local_5c + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x17e165);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffff20,__x);
    lVar2 = ggml_new_tensor_1d(*in_RDI,0,(long)*(int *)(in_RDI + 1));
    in_stack_ffffffffffffff20 =
         (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)ggml_nbytes(lVar2);
    pvVar3 = malloc((size_t)in_stack_ffffffffffffff20);
    *(void **)(lVar2 + 0xf8) = pvVar3;
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back
              (in_stack_ffffffffffffff20,(value_type *)__x);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

train_context(int n_embd_, int n_layers_) {
        n_embd = n_embd_;
        n_layers = n_layers_;
        struct ggml_init_params params_ggml = {
            /*.mem_size   =*/ ggml_tensor_overhead() * (n_layers - 1) * 2u,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };
        ctx_ggml = ggml_init(params_ggml);
        for (int il = 0; il < n_layers - 1; il++) {
            std::vector<uint8_t> empty;
            v_diff_tmp.push_back(empty);
            auto t = ggml_new_tensor_1d(ctx_ggml, GGML_TYPE_F32, n_embd);
            t->data = malloc(ggml_nbytes(t)); // TODO: get rid of malloc if possible
            v_final.push_back(t);
        }
    }